

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void estimateTableWidth(Table *pTab)

{
  LogEst LVar1;
  int local_24;
  Column *pCStack_20;
  int i;
  Column *pTabCol;
  uint wTable;
  Table *pTab_local;
  
  pTabCol._4_4_ = 0;
  pCStack_20 = pTab->aCol;
  for (local_24 = (int)pTab->nCol; 0 < local_24; local_24 = local_24 + -1) {
    pTabCol._4_4_ = (uint)pCStack_20->szEst + pTabCol._4_4_;
    pCStack_20 = pCStack_20 + 1;
  }
  if (pTab->iPKey < 0) {
    pTabCol._4_4_ = pTabCol._4_4_ + 1;
  }
  LVar1 = sqlite3LogEst((ulong)(uint)(pTabCol._4_4_ << 2));
  pTab->szTabRow = LVar1;
  return;
}

Assistant:

static void estimateTableWidth(Table *pTab){
  unsigned wTable = 0;
  const Column *pTabCol;
  int i;
  for(i=pTab->nCol, pTabCol=pTab->aCol; i>0; i--, pTabCol++){
    wTable += pTabCol->szEst;
  }
  if( pTab->iPKey<0 ) wTable++;
  pTab->szTabRow = sqlite3LogEst(wTable*4);
}